

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap3d_topology.cpp
# Opt level: O1

HostFew<Omega_h::Read<int>,_4> *
Omega_h::swap3d_topology
          (HostFew<Omega_h::Read<int>,_4> *__return_storage_ptr__,Mesh *mesh,LOs *keys2edges,
          Read<signed_char> *edge_configs,HostFew<Omega_h::Read<int>,_4> *keys2prods)

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char cVar3;
  byte bVar4;
  _Atomic_word _Var5;
  _Atomic_word _Var6;
  Alloc *pAVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  long *plVar9;
  _Atomic_word _Var10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int *piVar14;
  int iVar15;
  element_type *peVar16;
  undefined8 uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  byte bVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  char *__end;
  Int eev_1;
  int iVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  bool bVar35;
  Read<signed_char> edge_tet_codes;
  LOs edge_tets2tets;
  LOs edges2edge_tets;
  Few<int,_2> plane_edge_verts;
  LOs tet_verts2verts;
  LOs edge_verts2verts;
  HostFew<Omega_h::Write<int>,_4> prod_verts2verts_w;
  type f;
  Loop loop;
  Adj edges2tets;
  int local_488;
  Alloc *local_468;
  Alloc *local_458;
  Alloc *local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  int local_438;
  int iStack_434;
  int aiStack_430 [12];
  element_type *local_400;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3f0;
  element_type *local_3e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3e0;
  Write<int> local_3d8;
  Alloc *local_3c8;
  element_type *local_3c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b8;
  element_type *local_3b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3a0;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [32];
  Alloc *local_338;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_330;
  Alloc *local_328;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_320;
  Alloc *local_318;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_310;
  Alloc *local_308;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_300;
  Alloc *local_2f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  ulong auStack_2e8 [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  ulong auStack_2a8 [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_280;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_ptr<const_Omega_h::Adj,_(__gnu_cxx::_Lock_policy)2> local_268;
  __shared_ptr<const_Omega_h::Adj,_(__gnu_cxx::_Lock_policy)2> local_258;
  __shared_ptr<const_Omega_h::Adj,_(__gnu_cxx::_Lock_policy)2> local_248;
  __shared_ptr<const_Omega_h::Adj,_(__gnu_cxx::_Lock_policy)2> local_238;
  SharedAlloc local_228;
  SharedAlloc local_218;
  SharedAlloc local_208;
  ulong local_1f8 [16];
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  Alloc *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  Alloc *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  Alloc *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  Alloc *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  Alloc *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  Alloc *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  ulong auStack_108 [16];
  int local_88;
  Library *local_84;
  int aiStack_7c [7];
  Adj local_60;
  
  Mesh::ask_up(&local_60,mesh,1,3);
  local_448 = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == 1) {
      local_448 = (Alloc *)((long)(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_440._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_458 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == 1) {
      local_458 = (Alloc *)((long)(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_468 = local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == 1) {
      local_468 = (Alloc *)((long)(local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  Mesh::ask_verts_of((Mesh *)&local_3b8,(Int)mesh);
  Mesh::ask_verts_of((Mesh *)&local_3c8,(Int)mesh);
  local_368 = (undefined1  [16])0x0;
  local_378 = (undefined1  [16])0x0;
  local_388 = (undefined1  [16])0x0;
  local_398._0_4_ = 0;
  local_398._4_4_ = 0;
  local_398._8_4_ = 0;
  local_398._12_4_ = 0;
  iVar30 = 2;
  lVar19 = 0;
  do {
    iVar12 = Read<int>::last((Read<int> *)
                             ((long)&keys2prods->array_[1].write_.shared_alloc_.alloc + lVar19));
    local_358._0_8_ = (Alloc *)(local_358 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"","");
    Write<int>::Write((Write<int> *)&local_268,iVar12 * iVar30,(string *)local_358);
    pAVar7 = *(Alloc **)(local_388 + lVar19);
    if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
      piVar14 = &pAVar7->use_count;
      *piVar14 = *piVar14 + -1;
      if (*piVar14 == 0) {
        Alloc::~Alloc(pAVar7);
        operator_delete(pAVar7,0x48);
      }
    }
    *(element_type **)(local_388 + lVar19) = local_268._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_388 + lVar19 + 8) =
         local_268._M_refcount._M_pi;
    if ((((undefined1  [16])local_268 & (undefined1  [16])0x7) == (undefined1  [16])0x0 &&
         local_268._M_ptr != (element_type *)0x0) && (entering_parallel == 1)) {
      *(int *)&local_268._M_ptr[1].super_Graph.a2ab.write_.shared_alloc_.alloc =
           *(int *)&local_268._M_ptr[1].super_Graph.a2ab.write_.shared_alloc_.alloc + -1;
      *(long *)(local_388 + lVar19) =
           (long)((local_268._M_ptr)->super_Graph).a2ab.write_.shared_alloc_.alloc * 8 + 1;
    }
    local_268._M_ptr = (element_type *)0x0;
    local_268._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
    }
    lVar19 = lVar19 + 0x10;
    iVar30 = iVar30 + 1;
  } while (lVar19 != 0x30);
  local_178 = (element_type *)(keys2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_178 & 1) == 0) {
    peVar16 = (local_178->parent_comm_).
              super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    peVar16 = (element_type *)((ulong)local_178 >> 3);
  }
  if (((ulong)local_178 & 7) == 0 && local_178 != (element_type *)0x0) {
    if (entering_parallel == 1) {
      local_178 = (element_type *)
                  ((long)(local_178->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    else {
      *(int *)&local_178->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_178->items2content_[0].write_.shared_alloc_.alloc + 1;
    }
  }
  _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (keys2edges->write_).shared_alloc_.direct_ptr;
  local_170._M_pi = _Var8._M_pi;
  local_168 = (edge_configs->write_).shared_alloc_.alloc;
  if (local_168 != (Alloc *)0x0 && ((ulong)local_168 & 7) == 0) {
    if (entering_parallel == 1) {
      local_168 = (Alloc *)(local_168->size * 8 + 1);
    }
    else {
      local_168->use_count = local_168->use_count + 1;
    }
  }
  local_160._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (edge_configs->write_).shared_alloc_.direct_ptr;
  local_158 = local_448;
  if (((ulong)local_448 & 7) == 0 && local_448 != (Alloc *)0x0) {
    if (entering_parallel == 1) {
      local_158 = (Alloc *)(local_448->size * 8 + 1);
    }
    else {
      local_448->use_count = local_448->use_count + 1;
    }
  }
  local_150._M_pi = local_440._M_pi;
  local_148 = local_458;
  if (((ulong)local_458 & 7) == 0 && local_458 != (Alloc *)0x0) {
    if (entering_parallel == 1) {
      local_148 = (Alloc *)(local_458->size * 8 + 1);
    }
    else {
      local_458->use_count = local_458->use_count + 1;
    }
  }
  local_140._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_138 = local_468;
  if (((ulong)local_468 & 7) == 0 && local_468 != (Alloc *)0x0) {
    if (entering_parallel == 1) {
      local_138 = (Alloc *)(local_468->size * 8 + 1);
    }
    else {
      local_468->use_count = local_468->use_count + 1;
    }
  }
  local_130._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.codes.write_.shared_alloc_.direct_ptr;
  local_128 = (Alloc *)local_3b8._M_pi;
  if (((ulong)local_3b8._M_pi & 7) == 0 && (Alloc *)local_3b8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == 1) {
      local_128 = (Alloc *)((long)(local_3b8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_3b8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_3b8._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0;
  local_118 = local_3c8;
  if (((ulong)local_3c8 & 7) == 0 && local_3c8 != (Alloc *)0x0) {
    if (entering_parallel == 1) {
      local_118 = (Alloc *)(local_3c8->size * 8 + 1);
    }
    else {
      local_3c8->use_count = local_3c8->use_count + 1;
    }
  }
  bVar4 = entering_parallel;
  local_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0;
  lVar19 = 0x70;
  do {
    plVar9 = *(long **)((long)(keys2prods->array_ + -7) + lVar19);
    *(long **)((long)&local_178 + lVar19) = plVar9;
    if (((ulong)plVar9 & 7) == 0 && plVar9 != (long *)0x0) {
      if ((bVar4 & 1) == 0) {
        *(int *)(plVar9 + 6) = (int)plVar9[6] + 1;
      }
      else {
        *(long *)((long)&local_178 + lVar19) = *plVar9 * 8 + 1;
      }
    }
    *(undefined8 *)((long)&local_170._M_pi + lVar19) =
         *(undefined8 *)((long)keys2prods->array_ + lVar19 + -0x68);
    lVar19 = lVar19 + 0x10;
  } while (lVar19 != 0xb0);
  lVar19 = 0xb0;
  do {
    plVar9 = *(long **)((long)&local_448 + lVar19);
    *(long **)((long)&local_178 + lVar19) = plVar9;
    if (((ulong)plVar9 & 7) == 0 && plVar9 != (long *)0x0) {
      if ((bVar4 & 1) == 0) {
        *(int *)(plVar9 + 6) = (int)plVar9[6] + 1;
      }
      else {
        *(long *)((long)&local_178 + lVar19) = *plVar9 * 8 + 1;
      }
    }
    *(undefined8 *)((long)&local_170._M_pi + lVar19) =
         *(undefined8 *)((long)&local_440._M_pi + lVar19);
    lVar19 = lVar19 + 0x10;
  } while (lVar19 != 0xf0);
  local_268._M_ptr = (element_type *)local_178;
  if (((ulong)local_178 & 7) == 0 && local_178 != (element_type *)0x0) {
    if ((bVar4 & 1) == 0) {
      *(int *)&local_178->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_178->items2content_[0].write_.shared_alloc_.alloc + 1;
    }
    else {
      local_268._M_ptr =
           (element_type *)
           ((long)(local_178->parent_comm_).
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 + 1);
    }
  }
  local_268._M_refcount._M_pi = _Var8._M_pi;
  local_258._M_ptr = (element_type *)local_168;
  if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
    if ((bVar4 & 1) == 0) {
      local_168->use_count = local_168->use_count + 1;
    }
    else {
      local_258._M_ptr = (element_type *)(local_168->size * 8 + 1);
    }
  }
  local_3f0 = local_160._M_pi;
  local_258._M_refcount._M_pi = local_160._M_pi;
  local_248._M_ptr = (element_type *)local_158;
  if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
    if ((bVar4 & 1) == 0) {
      local_158->use_count = local_158->use_count + 1;
    }
    else {
      local_248._M_ptr = (element_type *)(local_158->size * 8 + 1);
    }
  }
  local_3f8 = local_440._M_pi;
  local_248._M_refcount._M_pi = local_440._M_pi;
  local_238._M_ptr = (element_type *)local_148;
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    if ((bVar4 & 1) == 0) {
      local_148->use_count = local_148->use_count + 1;
    }
    else {
      local_238._M_ptr = (element_type *)(local_148->size * 8 + 1);
    }
  }
  local_238._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_228.alloc = local_138;
  if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
    if ((bVar4 & 1) == 0) {
      local_138->use_count = local_138->use_count + 1;
    }
    else {
      local_228.alloc = (Alloc *)(local_138->size * 8 + 1);
    }
  }
  local_3e8 = (element_type *)local_60.codes.write_.shared_alloc_.direct_ptr;
  local_228.direct_ptr = local_60.codes.write_.shared_alloc_.direct_ptr;
  local_218.alloc = local_128;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    if ((bVar4 & 1) == 0) {
      local_128->use_count = local_128->use_count + 1;
    }
    else {
      local_218.alloc = (Alloc *)(local_128->size * 8 + 1);
    }
  }
  local_400 = local_3b0;
  local_218.direct_ptr = local_3b0;
  local_208.alloc = local_118;
  if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
    if ((bVar4 & 1) == 0) {
      local_118->use_count = local_118->use_count + 1;
    }
    else {
      local_208.alloc = (Alloc *)(local_118->size * 8 + 1);
    }
  }
  local_3e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_208.direct_ptr = local_3c0;
  lVar19 = 0x70;
  do {
    plVar9 = *(long **)((long)&local_178 + lVar19);
    *(long **)((long)&local_268._M_ptr + lVar19) = plVar9;
    if (((ulong)plVar9 & 7) == 0 && plVar9 != (long *)0x0) {
      if ((bVar4 & 1) == 0) {
        *(int *)(plVar9 + 6) = (int)plVar9[6] + 1;
      }
      else {
        *(long *)((long)&local_268._M_ptr + lVar19) = *plVar9 * 8 + 1;
      }
    }
    *(undefined8 *)((long)&local_268._M_refcount._M_pi + lVar19) =
         *(undefined8 *)((long)&local_170._M_pi + lVar19);
    lVar19 = lVar19 + 0x10;
  } while (lVar19 != 0xb0);
  lVar19 = 0xb0;
  do {
    plVar9 = *(long **)((long)&local_178 + lVar19);
    *(long **)((long)&local_268._M_ptr + lVar19) = plVar9;
    if (((ulong)plVar9 & 7) == 0 && plVar9 != (long *)0x0) {
      if ((bVar4 & 1) == 0) {
        *(int *)(plVar9 + 6) = (int)plVar9[6] + 1;
      }
      else {
        *(long *)((long)&local_268._M_ptr + lVar19) = *plVar9 * 8 + 1;
      }
    }
    *(undefined8 *)((long)&local_268._M_refcount._M_pi + lVar19) =
         *(undefined8 *)((long)&local_170._M_pi + lVar19);
    lVar19 = lVar19 + 0x10;
  } while (lVar19 != 0xf0);
  local_488 = (int)((ulong)peVar16 >> 2);
  if (0 < local_488) {
    if (((ulong)local_268._M_ptr & 7) == 0 &&
        (element_type *)local_268._M_ptr != (element_type *)0x0) {
      *(int *)&(((LOs *)((long)local_268._M_ptr + 0x30))->write_).shared_alloc_.alloc =
           *(int *)&(((LOs *)((long)local_268._M_ptr + 0x30))->write_).shared_alloc_.alloc + -1;
      local_268._M_ptr =
           (element_type *)
           ((long)(((CommPtr *)&(local_268._M_ptr)->super_Graph)->
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr * 8 + 1);
    }
    local_358._8_8_ = _Var8._M_pi;
    local_358._0_8_ = local_268._M_ptr;
    local_268._M_ptr = (element_type *)0x0;
    local_268._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_358._16_8_ = local_258._M_ptr;
    local_358._24_8_ = local_160._M_pi;
    if (((ulong)local_258._M_ptr & 7) == 0 && (Alloc *)local_258._M_ptr != (Alloc *)0x0) {
      *(int *)((long)local_258._M_ptr + 0x30) = *(int *)((long)local_258._M_ptr + 0x30) + -1;
      local_358._16_8_ = (Alloc *)(*(size_t *)&(local_258._M_ptr)->super_Graph * 8 + 1);
    }
    local_258._M_ptr = (element_type *)0x0;
    local_258._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_338 = (Alloc *)local_248._M_ptr;
    local_330._M_pi = local_440._M_pi;
    if (((ulong)local_248._M_ptr & 7) == 0 && (Alloc *)local_248._M_ptr != (Alloc *)0x0) {
      *(int *)((long)local_248._M_ptr + 0x30) = *(int *)((long)local_248._M_ptr + 0x30) + -1;
      local_338 = (Alloc *)(*(size_t *)&(local_248._M_ptr)->super_Graph * 8 + 1);
    }
    local_248._M_ptr = (element_type *)0x0;
    local_248._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_328 = (Alloc *)local_238._M_ptr;
    local_320._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_238._M_ptr & 7) == 0 && (Alloc *)local_238._M_ptr != (Alloc *)0x0) {
      *(int *)((long)local_238._M_ptr + 0x30) = *(int *)((long)local_238._M_ptr + 0x30) + -1;
      local_328 = (Alloc *)(*(size_t *)&(local_238._M_ptr)->super_Graph * 8 + 1);
    }
    local_238._M_ptr = (element_type *)0x0;
    local_238._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_318 = local_228.alloc;
    local_310._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_60.codes.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_228.alloc & 7) == 0 && local_228.alloc != (Alloc *)0x0) {
      (local_228.alloc)->use_count = (local_228.alloc)->use_count + -1;
      local_318 = (Alloc *)((local_228.alloc)->size * 8 + 1);
    }
    local_228.alloc = (Alloc *)0x0;
    local_228.direct_ptr = (void *)0x0;
    local_308 = local_218.alloc;
    local_300._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0;
    if (((ulong)local_218.alloc & 7) == 0 && local_218.alloc != (Alloc *)0x0) {
      (local_218.alloc)->use_count = (local_218.alloc)->use_count + -1;
      local_308 = (Alloc *)((local_218.alloc)->size * 8 + 1);
    }
    local_218.alloc = (Alloc *)0x0;
    local_218.direct_ptr = (void *)0x0;
    local_2f8 = local_208.alloc;
    local_2f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0;
    if (((ulong)local_208.alloc & 7) == 0 && local_208.alloc != (Alloc *)0x0) {
      (local_208.alloc)->use_count = (local_208.alloc)->use_count + -1;
      local_2f8 = (Alloc *)((local_208.alloc)->size * 8 + 1);
    }
    local_208.alloc = (Alloc *)0x0;
    local_208.direct_ptr = (void *)0x0;
    lVar19 = 0x70;
    do {
      plVar9 = *(long **)((long)&local_268._M_ptr + lVar19);
      uVar17 = *(undefined8 *)((long)&local_268._M_refcount._M_pi + lVar19);
      *(long **)(local_358 + lVar19) = plVar9;
      *(undefined8 *)(local_358 + lVar19 + 8) = uVar17;
      if (((ulong)plVar9 & 7) == 0 && plVar9 != (long *)0x0) {
        *(int *)(plVar9 + 6) = (int)plVar9[6] + -1;
        *(long *)(local_358 + lVar19) = *plVar9 * 8 + 1;
      }
      *(undefined1 (*) [16])((long)&local_268._M_ptr + lVar19) = (undefined1  [16])0x0;
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0xb0);
    lVar19 = 0xb0;
    do {
      plVar9 = *(long **)((long)&local_268._M_ptr + lVar19);
      uVar17 = *(undefined8 *)((long)&local_268._M_refcount._M_pi + lVar19);
      *(long **)(local_358 + lVar19) = plVar9;
      *(undefined8 *)(local_358 + lVar19 + 8) = uVar17;
      if (((ulong)plVar9 & 7) == 0 && plVar9 != (long *)0x0) {
        *(int *)(plVar9 + 6) = (int)plVar9[6] + -1;
        *(long *)(local_358 + lVar19) = *plVar9 * 8 + 1;
      }
      *(undefined1 (*) [16])((long)&local_268._M_ptr + lVar19) = (undefined1  [16])0x0;
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0xf0);
    entering_parallel = 0;
    local_3a8._M_pi = local_2d0._M_pi;
    local_3a0 = local_290._M_pi;
    lVar19 = 0;
    do {
      lVar13 = (long)*(int *)((long)&(_Var8._M_pi)->_vptr__Sp_counted_base + lVar19 * 4);
      cVar3 = *(char *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                               &local_3f0->_vptr__Sp_counted_base)->_M_ptr + lVar13);
      lVar24 = (long)*(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                       *)&local_3f8->_vptr__Sp_counted_base)->_M_ptr + lVar13 * 4);
      uVar22 = *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                               &local_3f8->_vptr__Sp_counted_base)->_M_ptr + lVar13 * 4 + 4) -
               lVar24;
      iVar30 = (int)uVar22;
      local_88 = iVar30;
      if (iVar30 < 8) {
        if (iVar30 < 3) {
          uVar17 = 0x20;
          pcVar21 = "loop.size >= 3";
LAB_003fc485:
          fail("assertion %s failed at %s +%d\n",pcVar21,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_swap3d_loop.hpp"
               ,uVar17);
        }
        local_84 = (&local_400->library_)[lVar13];
        aiStack_430[6] = 0xffffffff;
        aiStack_430[7] = 0xffffffff;
        aiStack_430[8] = 0xffffffff;
        aiStack_430[9] = 0xffffffff;
        aiStack_430[2] = 0xffffffff;
        aiStack_430[3] = 0xffffffff;
        aiStack_430[4] = 0xffffffff;
        aiStack_430[5] = 0xffffffff;
        local_438 = -1;
        iStack_434 = -1;
        aiStack_430[0] = -1;
        aiStack_430[1] = 0xffffffff;
        aiStack_430[10] = -1;
        aiStack_430[0xb] = -1;
        uVar18 = uVar22 & 0xffffffff;
        piVar14 = &local_438;
        uVar27 = 0;
        do {
          lVar13 = lVar24 + uVar27;
          bVar4 = *(byte *)((long)&(local_3e8->super_Graph).a2ab.write_.shared_alloc_.alloc + lVar13
                           );
          bVar23 = (char)bVar4 >> 3;
          uVar33 = 0xffffffff;
          if (bVar23 < 6) {
            uVar33 = *(uint *)(&DAT_0044ebb8 + (ulong)bVar23 * 4);
          }
          iVar12 = *(int *)((long)&local_3e0->_vptr__Sp_counted_base + lVar13 * 4);
          uVar28 = bVar4 >> 1 & 3;
          uVar26 = (ulong)uVar28;
          uVar25 = 0;
          do {
            if (5 < uVar33) {
              iVar15 = -1;
              goto LAB_003fbe8b;
            }
            uVar31 = (uint)uVar25 ^ uVar28;
            switch(uVar33) {
            case 0:
              if (uVar26 == uVar25) {
LAB_003fbe4c:
                iVar15 = 0;
              }
              else {
                iVar15 = (uint)(uVar31 == 1) * 2 + -1;
              }
              break;
            case 1:
              iVar15 = 1;
              if (uVar26 != uVar25) {
                iVar15 = (uint)(uVar31 == 1) * 3 + -1;
              }
              break;
            case 2:
              iVar15 = 2;
              if (uVar26 != uVar25) {
                iVar15 = -(uint)(uVar31 != 1);
              }
              break;
            case 3:
              if (uVar26 == uVar25) goto LAB_003fbe4c;
              goto LAB_003fbe74;
            case 4:
              iVar15 = 1;
              goto LAB_003fbe6f;
            case 5:
              iVar15 = 2;
LAB_003fbe6f:
              if (uVar26 != uVar25) {
LAB_003fbe74:
                iVar15 = (uint)(uVar31 == 1) * 4 + -1;
              }
            }
LAB_003fbe8b:
            piVar14[uVar25] =
                 *(int *)((long)&local_3c0->library_ + ((long)iVar15 + (long)iVar12 * 4) * 4);
            uVar25 = uVar25 + 1;
          } while (uVar25 == 1);
          uVar27 = uVar27 + 1;
          piVar14 = piVar14 + 2;
        } while (uVar27 != uVar18);
        uVar27 = 1;
        if (1 < iVar30) {
          uVar27 = uVar22 & 0xffffffff;
        }
        iVar12 = 2;
        if (2 < iVar30) {
          iVar12 = iVar30;
        }
        uVar26 = 1;
        uVar34 = 2;
        uVar25 = 0;
        do {
          uVar17 = 0x47;
          if (uVar25 == (int)uVar27 - 1) {
LAB_003fc47e:
            pcVar21 = "j < loop.size";
            goto LAB_003fc485;
          }
          uVar1 = uVar25 + 1;
          bVar35 = uVar1 < uVar18;
          uVar29 = uVar26;
          uVar11 = uVar34;
          if ((&local_438)[uVar26 * 2] != aiStack_430[uVar25 * 2 + -1]) {
            do {
              uVar29 = uVar11;
              if (uVar18 <= uVar29) goto LAB_003fc47e;
              uVar11 = uVar29 + 1;
            } while ((&local_438)[uVar29 * 2] != aiStack_430[uVar25 * 2 + -1]);
            bVar35 = true;
          }
          if (!bVar35) goto LAB_003fc47e;
          uVar17 = *(undefined8 *)(&local_438 + uVar1 * 2);
          *(undefined8 *)(&local_438 + uVar1 * 2) =
               *(undefined8 *)(&local_438 + (uVar29 & 0xffffffff) * 2);
          *(undefined8 *)(&local_438 + (uVar29 & 0xffffffff) * 2) = uVar17;
          uVar26 = uVar26 + 1;
          uVar34 = uVar34 + 1;
          uVar25 = uVar1;
        } while (uVar1 != iVar12 - 1);
        uVar18 = 0;
        do {
          aiStack_7c[uVar18] = (&local_438)[uVar18 * 2];
          uVar18 = uVar18 + 1;
        } while (uVar27 != uVar18);
      }
      uVar33 = *(uint *)(swap3d::swap_mesh_sizes + uVar22 * 4);
      uVar18 = (ulong)uVar33;
      uVar28 = *(uint *)(swap3d::nedges + uVar22 * 4);
      if ((uVar22 & 0xfffffffffffffffc) == 4) {
        lVar13 = *(long *)(*(long *)(swap3d::edges2unique + uVar22 * 8) + (long)cVar3 * 8);
        lVar24 = *(long *)(swap3d::unique_edges + uVar22 * 8);
        uVar27 = 1;
        if (1 < (int)uVar28) {
          uVar27 = (ulong)uVar28;
        }
        iVar30 = 0;
        uVar25 = 0;
        do {
          iVar12 = *(int *)(lVar13 + uVar25 * 4);
          lVar32 = 0;
          do {
            (&local_438)[lVar32] = aiStack_7c[*(int *)(lVar24 + (long)iVar12 * 8 + lVar32 * 4)];
            lVar32 = lVar32 + 1;
          } while (lVar32 == 1);
          (&local_3a0->_vptr__Sp_counted_base)
          [(long)(int)uVar25 +
           (long)*(int *)((long)&(local_3a8._M_pi)->_vptr__Sp_counted_base + lVar19 * 4)] =
               (_func_int **)CONCAT44(iStack_434,local_438);
          lVar32 = 0;
          do {
            _Var5 = *(_Atomic_word *)((long)&local_84 + lVar32 * 4);
            lVar20 = (long)((iVar30 + (int)lVar32 +
                            *(int *)((long)&(local_2c0._M_pi)->_vptr__Sp_counted_base + lVar19 * 4))
                           * 3);
            *(_func_int ***)((long)&(local_280._M_pi)->_vptr__Sp_counted_base + lVar20 * 4) =
                 (_func_int **)CONCAT44(iStack_434,local_438);
            (&(local_280._M_pi)->_M_use_count)[lVar20] = _Var5;
            lVar32 = lVar32 + 1;
          } while (lVar32 == 1);
          uVar25 = uVar25 + 1;
          iVar30 = iVar30 + 2;
        } while (uVar25 != uVar27);
      }
      if (uVar22 - 3 < 5) {
        lVar13 = *(long *)(swap3d::swap_triangles + uVar22 * 8);
        if ((int)uVar33 < 2) {
          uVar18 = 1;
        }
        lVar24 = *(long *)(swap3d::swap_meshes + uVar22 * 8);
        iVar30 = 0;
        uVar22 = 0;
        do {
          iVar12 = *(int *)((long)(int)((int)cVar3 * uVar33) * 4 + lVar24 + uVar22 * 4);
          lVar32 = 0;
          do {
            (&local_438)[lVar32] = aiStack_7c[*(int *)(lVar13 + (long)iVar12 * 0xc + lVar32 * 4)];
            lVar32 = lVar32 + 1;
          } while (lVar32 != 3);
          lVar32 = (long)(int)((uVar28 * 2 + (int)uVar22 +
                               *(int *)((long)&(local_2c0._M_pi)->_vptr__Sp_counted_base +
                                       lVar19 * 4)) * 3);
          (&(local_280._M_pi)->_M_use_count)[lVar32] = aiStack_430[0];
          *(ulong *)((long)&(local_280._M_pi)->_vptr__Sp_counted_base + lVar32 * 4) =
               CONCAT44(iStack_434,local_438);
          lVar32 = 0;
          do {
            _Var5 = aiStack_430[0];
            _Var10 = iStack_434;
            if (lVar32 == 0) {
              _Var5 = iStack_434;
              _Var10 = aiStack_430[0];
            }
            _Var6 = *(_Atomic_word *)((long)&local_84 + lVar32 * 4);
            lVar20 = (long)((iVar30 + (int)lVar32 +
                            *(int *)((long)&(local_2b0._M_pi)->_vptr__Sp_counted_base + lVar19 * 4))
                           * 4);
            *(int *)((long)&(local_270._M_pi)->_vptr__Sp_counted_base + lVar20 * 4) = local_438;
            *(_Atomic_word *)((long)&(local_270._M_pi)->_vptr__Sp_counted_base + lVar20 * 4 + 4) =
                 _Var10;
            (&(local_270._M_pi)->_M_use_count)[lVar20] = _Var5;
            (&(local_270._M_pi)->_M_weak_count)[lVar20] = _Var6;
            lVar32 = lVar32 + 1;
          } while (lVar32 == 1);
          uVar22 = uVar22 + 1;
          iVar30 = iVar30 + 2;
        } while (uVar22 != uVar18);
      }
      lVar19 = lVar19 + 1;
    } while ((int)lVar19 != local_488);
    swap3d_topology(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::HostFew<Omega_h::Read<int>,4>)
    ::$_0::~__0((__0 *)local_358);
  }
  swap3d_topology(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::HostFew<Omega_h::Read<int>,4>)
  ::$_0::~__0((__0 *)&local_268);
  __return_storage_ptr__->array_[3].write_.shared_alloc_ = (SharedAlloc)0x0;
  __return_storage_ptr__->array_[2].write_.shared_alloc_ = (SharedAlloc)0x0;
  __return_storage_ptr__->array_[1].write_.shared_alloc_ = (SharedAlloc)0x0;
  __return_storage_ptr__->array_[0].write_.shared_alloc_ = (SharedAlloc)0x0;
  lVar19 = 0x18;
  do {
    local_3d8.shared_alloc_.alloc = *(Alloc **)(local_398 + lVar19 + -8);
    if (((ulong)local_3d8.shared_alloc_.alloc & 7) == 0 &&
        local_3d8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == 1) {
        local_3d8.shared_alloc_.alloc = (Alloc *)((local_3d8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_3d8.shared_alloc_.alloc)->use_count = (local_3d8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_3d8.shared_alloc_.direct_ptr = *(void **)(local_398 + lVar19);
    Read<int>::Read((Read<signed_char> *)local_358,&local_3d8);
    pAVar7 = *(Alloc **)((long)__return_storage_ptr__->array_ + lVar19 + -8);
    if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
      piVar14 = &pAVar7->use_count;
      *piVar14 = *piVar14 + -1;
      if (*piVar14 == 0) {
        Alloc::~Alloc(pAVar7);
        operator_delete(pAVar7,0x48);
      }
    }
    pAVar7 = local_3d8.shared_alloc_.alloc;
    *(undefined8 *)((long)__return_storage_ptr__->array_ + lVar19 + -8) = local_358._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->array_[0].write_.shared_alloc_.alloc + lVar19) =
         local_358._8_8_;
    if (((local_358._0_16_ & (undefined1  [16])0x7) == (undefined1  [16])0x0 &&
         (pointer)local_358._0_8_ != (pointer)0x0) && (entering_parallel == 1)) {
      *(int *)&(((pointer)(local_358._0_8_ + 0x30))->
               super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((pointer)(local_358._0_8_ + 0x30))->
                    super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
           -1;
      *(long *)((long)__return_storage_ptr__->array_ + lVar19 + -8) =
           *(long *)local_358._0_8_ * 8 + 1;
    }
    local_358._0_8_ = (Alloc *)0x0;
    local_358._8_8_ = (void *)0x0;
    if (((ulong)local_3d8.shared_alloc_.alloc & 7) == 0 &&
        local_3d8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar14 = &(local_3d8.shared_alloc_.alloc)->use_count;
      *piVar14 = *piVar14 + -1;
      if (*piVar14 == 0) {
        Alloc::~Alloc(local_3d8.shared_alloc_.alloc);
        operator_delete(pAVar7,0x48);
      }
    }
    lVar19 = lVar19 + 0x10;
  } while (lVar19 != 0x48);
  swap3d_topology(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::HostFew<Omega_h::Read<int>,4>)
  ::$_0::~__0((__0 *)&local_178);
  lVar19 = 0x40;
  do {
    pAVar7 = *(Alloc **)((long)&local_3a8._M_pi + lVar19);
    if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
      piVar14 = &pAVar7->use_count;
      *piVar14 = *piVar14 + -1;
      if (*piVar14 == 0) {
        Alloc::~Alloc(pAVar7);
        operator_delete(pAVar7,0x48);
      }
    }
    lVar19 = lVar19 + -0x10;
  } while (lVar19 != 0);
  if (((ulong)local_3c8 & 7) == 0 && local_3c8 != (Alloc *)0x0) {
    piVar14 = &local_3c8->use_count;
    *piVar14 = *piVar14 + -1;
    if (*piVar14 == 0) {
      Alloc::~Alloc(local_3c8);
      operator_delete(local_3c8,0x48);
    }
  }
  if (((ulong)local_3b8._M_pi & 7) == 0 && (Alloc *)local_3b8._M_pi != (Alloc *)0x0) {
    p_Var2 = local_3b8._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_3b8._M_pi);
      operator_delete(local_3b8._M_pi,0x48);
    }
  }
  if (((ulong)local_468 & 7) == 0 && local_468 != (Alloc *)0x0) {
    piVar14 = &local_468->use_count;
    *piVar14 = *piVar14 + -1;
    if (*piVar14 == 0) {
      Alloc::~Alloc(local_468);
      operator_delete(local_468,0x48);
    }
  }
  if (((ulong)local_458 & 7) == 0 && local_458 != (Alloc *)0x0) {
    piVar14 = &local_458->use_count;
    *piVar14 = *piVar14 + -1;
    if (*piVar14 == 0) {
      Alloc::~Alloc(local_458);
      operator_delete(local_458,0x48);
    }
  }
  pAVar7 = local_448;
  if (((ulong)local_448 & 7) == 0 && local_448 != (Alloc *)0x0) {
    piVar14 = &local_448->use_count;
    *piVar14 = *piVar14 + -1;
    if (*piVar14 == 0) {
      Alloc::~Alloc(local_448);
      operator_delete(pAVar7,0x48);
    }
  }
  Adj::~Adj(&local_60);
  return __return_storage_ptr__;
}

Assistant:

HostFew<LOs, 4> swap3d_topology(Mesh* mesh, LOs keys2edges,
    Read<I8> edge_configs, HostFew<LOs, 4> keys2prods) {
  auto edges2tets = mesh->ask_up(EDGE, REGION);
  auto edges2edge_tets = edges2tets.a2ab;
  auto edge_tets2tets = edges2tets.ab2b;
  auto edge_tet_codes = edges2tets.codes;
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto tet_verts2verts = mesh->ask_verts_of(REGION);
  HostFew<Write<LO>, 4> prod_verts2verts_w;
  for (Int prod_dim = EDGE; prod_dim <= REGION; ++prod_dim) {
    prod_verts2verts_w[prod_dim] =
        Write<LO>(keys2prods[prod_dim].last() * Int(prod_dim + 1));
  }
  auto nkeys = keys2edges.size();
  auto f = OMEGA_H_LAMBDA(LO key) {
    auto edge = keys2edges[key];
    auto config = edge_configs[edge];
    auto loop = swap3d::find_loop(edges2edge_tets, edge_tets2tets,
        edge_tet_codes, edge_verts2verts, tet_verts2verts, edge);
    auto nplane_tris = swap3d::swap_mesh_sizes[loop.size];
    auto nplane_edges = swap3d::nedges[loop.size];
    for (Int plane_edge = 0; plane_edge < nplane_edges; ++plane_edge) {
      auto unique_edge = swap3d::edges2unique[loop.size][config][plane_edge];
      Few<LO, 2> plane_edge_verts;
      for (Int pev = 0; pev < 2; ++pev) {
        auto loop_vert = swap3d::unique_edges[loop.size][unique_edge][pev];
        auto vert = loop.loop_verts2verts[loop_vert];
        plane_edge_verts[pev] = vert;
      }
      auto prod_edge = keys2prods[EDGE][key] + plane_edge;
      for (Int pev = 0; pev < 2; ++pev) {
        prod_verts2verts_w[EDGE][prod_edge * 2 + pev] = plane_edge_verts[pev];
      }
      for (Int eev = 0; eev < 2; ++eev) {
        Few<LO, 3> new_tri_verts;
        for (Int nfv = 0; nfv < 2; ++nfv) {
          new_tri_verts[nfv] = plane_edge_verts[nfv];
        }
        new_tri_verts[2] = loop.eev2v[eev];
        auto prod_tri = keys2prods[FACE][key] + 2 * plane_edge + eev;
        for (Int nfv = 0; nfv < 3; ++nfv) {
          prod_verts2verts_w[FACE][prod_tri * 3 + nfv] = new_tri_verts[nfv];
        }
      }
    }
    for (Int plane_tri = 0; plane_tri < nplane_tris; ++plane_tri) {
      auto uniq_tri =
          swap3d::swap_meshes[loop.size][config * nplane_tris + plane_tri];
      Few<LO, 3> plane_tri_verts;
      for (Int pfv = 0; pfv < 3; ++pfv) {
        auto loop_vert = swap3d::swap_triangles[loop.size][uniq_tri][pfv];
        auto vert = loop.loop_verts2verts[loop_vert];
        plane_tri_verts[pfv] = vert;
      }
      auto prod_tri = keys2prods[FACE][key] + 2 * nplane_edges + plane_tri;
      for (Int pfv = 0; pfv < 3; ++pfv) {
        prod_verts2verts_w[FACE][prod_tri * 3 + pfv] = plane_tri_verts[pfv];
      }
      for (Int eev = 0; eev < 2; ++eev) {
        auto prod_tet = keys2prods[REGION][key] + 2 * plane_tri + eev;
        Few<LO, 4> new_tet_verts;
        for (Int pfv = 0; pfv < 3; ++pfv) {
          new_tet_verts[pfv] = plane_tri_verts[pfv];
        }
        if (eev == 0) swap2(new_tet_verts[1], new_tet_verts[2]);
        new_tet_verts[3] = loop.eev2v[eev];
        for (Int nrv = 0; nrv < 4; ++nrv) {
          prod_verts2verts_w[REGION][prod_tet * 4 + nrv] = new_tet_verts[nrv];
        }
      }
    }
  };
  parallel_for(nkeys, f, "swap3d_topology");
  HostFew<LOs, 4> prod_verts2verts;
  for (Int prod_dim = EDGE; prod_dim <= REGION; ++prod_dim) {
    prod_verts2verts[prod_dim] = prod_verts2verts_w[prod_dim];
  }
  return prod_verts2verts;
}